

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

void __thiscall CChat::CChat(CChat *this)

{
  (this->super_CComponent)._vptr_CComponent = (_func_int **)&PTR__CChat_00213ae8;
  CLineInput::CLineInput(&this->m_Input);
  CRingBufferBase::Init
            (&(this->m_History).super_CRingBufferBase,(this->m_History).m_aBuffer,0x10000,1);
  (this->m_aFilter).list = (bool *)0x0;
  array<bool,_allocator_default<bool>_>::clear(&this->m_aFilter);
  CCommandManager::CCommandManager(&this->m_CommandManager);
  this->m_aInputBuf[0] = '\0';
  CLineInput::SetBuffer(&this->m_Input,this->m_aInputBuf,0x200,0x200);
  return;
}

Assistant:

CChat::CChat()
{
	m_aInputBuf[0] = '\0';
	m_Input.SetBuffer(m_aInputBuf, sizeof(m_aInputBuf));
}